

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.cxx
# Opt level: O2

string * __thiscall cm::String::str_abi_cxx11_(String *this)

{
  string *psVar1;
  
  psVar1 = str_if_stable_abi_cxx11_(this);
  if (psVar1 == (string *)0x0) {
    internally_mutate_to_stable_string(this);
    psVar1 = (this->string_).
             super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  }
  return psVar1;
}

Assistant:

std::string const& String::str()
{
  if (std::string const* s = this->str_if_stable()) {
    return *s;
  }
  // Mutate to hold a std::string that is stable for the lifetime
  // of our current value.
  this->internally_mutate_to_stable_string();
  return *this->string_;
}